

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O2

void __thiscall
QWidgetRepaintManager::markNeedsFlush
          (QWidgetRepaintManager *this,QWidget *widget,QRegion *region,QPoint *topLevelOffset)

{
  bool bVar1;
  char cVar2;
  QWidget *parent;
  QLoggingCategory *pQVar3;
  QDebug *pQVar4;
  QPoint *pQVar5;
  QPoint QVar6;
  long in_FS_OFFSET;
  QRegion local_c0;
  Stream *local_b8;
  QDebug local_b0;
  QRegion local_a8;
  undefined1 local_a0 [8];
  undefined1 local_98 [8];
  QPoint local_90;
  QDebug local_88;
  QPoint local_80;
  undefined4 uStack_78;
  undefined8 uStack_74;
  undefined4 local_6c;
  char *local_68;
  QDebug local_60;
  QRegion local_58;
  QDebug local_50;
  Stream *local_48;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget != (QWidget *)0x0) {
    bVar1 = QWidgetPrivate::shouldPaintOnScreen(*(QWidgetPrivate **)&widget->field_0x8);
    if (!bVar1) {
      cVar2 = QRegion::isEmpty();
      if (cVar2 == '\0') {
        if (*(QWidget **)this == widget) {
          pQVar3 = QtPrivateLogging::lcWidgetPainting();
          if (((pQVar3->field_2).bools.enabledInfo._q_value._M_base._M_i & 1U) != 0) {
            local_68 = pQVar3->name;
            local_80.xp.m_i = 2;
            local_80.yp.m_i = 0;
            uStack_78 = 0;
            uStack_74 = 0;
            local_6c = 0;
            QMessageLogger::info();
            pQVar4 = QDebug::operator<<(&local_60,"Marking");
            local_58.d = (QRegionData *)pQVar4->stream;
            *(int *)((Stream *)local_58.d + 0x28) = *(int *)((Stream *)local_58.d + 0x28) + 1;
            ::operator<<((Stream *)&local_50,&local_58);
            pQVar4 = QDebug::operator<<(&local_50,"of top level");
            local_48 = pQVar4->stream;
            *(int *)(local_48 + 0x28) = *(int *)(local_48 + 0x28) + 1;
            ::operator<<((Stream *)&local_40,(QWidget *)&local_48);
            QDebug::operator<<((QDebug *)&local_40,"as needing flush");
            QDebug::~QDebug((QDebug *)&local_40);
            QDebug::~QDebug((QDebug *)&local_48);
            QDebug::~QDebug(&local_50);
            QDebug::~QDebug((QDebug *)&local_58);
            QDebug::~QDebug(&local_60);
          }
          QRegion::operator+=((QRegion *)(this + 0x48),region);
        }
        else {
          bVar1 = hasPlatformWindow(widget);
          if ((bVar1) ||
             (((widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
               super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) {
            pQVar3 = QtPrivateLogging::lcWidgetPainting();
            if (((pQVar3->field_2).bools.enabledInfo._q_value._M_base._M_i & 1U) != 0) {
              local_68 = pQVar3->name;
              local_80.xp.m_i = 2;
              local_80.yp.m_i = 0;
              uStack_78 = 0;
              uStack_74 = 0;
              local_6c = 0;
              QMessageLogger::info();
              pQVar4 = QDebug::operator<<(&local_60,"Marking");
              local_c0.d = (QRegionData *)pQVar4->stream;
              *(int *)((Stream *)local_c0.d + 0x28) = *(int *)((Stream *)local_c0.d + 0x28) + 1;
              ::operator<<((Stream *)&local_50,&local_c0);
              pQVar4 = QDebug::operator<<(&local_50,"of native child");
              local_b8 = pQVar4->stream;
              *(int *)(local_b8 + 0x28) = *(int *)(local_b8 + 0x28) + 1;
              ::operator<<((Stream *)&local_40,(QWidget *)&local_b8);
              QDebug::operator<<((QDebug *)&local_40,"as needing flush");
              QDebug::~QDebug((QDebug *)&local_40);
              QDebug::~QDebug((QDebug *)&local_b8);
              QDebug::~QDebug(&local_50);
              QDebug::~QDebug((QDebug *)&local_c0);
              QDebug::~QDebug(&local_60);
            }
            markNeedsFlush(this,widget,region);
          }
          else {
            parent = QWidget::nativeParentWidget(widget);
            pQVar3 = QtPrivateLogging::lcWidgetPainting();
            if (((pQVar3->field_2).bools.enabledInfo._q_value._M_base._M_i & 1U) != 0) {
              local_68 = pQVar3->name;
              local_80.xp.m_i = 2;
              local_80.yp.m_i = 0;
              uStack_78 = 0;
              uStack_74 = 0;
              local_6c = 0;
              QMessageLogger::info();
              pQVar4 = QDebug::operator<<(&local_b0,"Marking");
              local_a8.d = (QRegionData *)pQVar4->stream;
              *(int *)((Stream *)local_a8.d + 0x28) = *(int *)((Stream *)local_a8.d + 0x28) + 1;
              ::operator<<((Stream *)&local_60,&local_a8);
              pQVar4 = QDebug::operator<<(&local_60,"of");
              local_a0 = (undefined1  [8])pQVar4->stream;
              *(int *)((long)local_a0 + 0x28) = *(int *)((long)local_a0 + 0x28) + 1;
              ::operator<<((Stream *)&local_50,(QWidget *)local_a0);
              pQVar4 = QDebug::operator<<(&local_50,"as needing flush in");
              local_98 = (undefined1  [8])pQVar4->stream;
              *(int *)((long)local_98 + 0x28) = *(int *)((long)local_98 + 0x28) + 1;
              ::operator<<((Stream *)&local_40,(QWidget *)local_98);
              pQVar5 = (QPoint *)QDebug::operator<<((QDebug *)&local_40,"at offset");
              local_90 = *pQVar5;
              *(int *)((long)local_90 + 0x28) = *(int *)((long)local_90 + 0x28) + 1;
              ::operator<<((Stream *)&local_88,&local_90);
              QDebug::~QDebug(&local_88);
              QDebug::~QDebug((QDebug *)&local_90);
              QDebug::~QDebug((QDebug *)&local_40);
              QDebug::~QDebug((QDebug *)local_98);
              QDebug::~QDebug(&local_50);
              QDebug::~QDebug((QDebug *)local_a0);
              QDebug::~QDebug(&local_60);
              QDebug::~QDebug((QDebug *)&local_a8);
              QDebug::~QDebug(&local_b0);
            }
            if (parent == *(QWidget **)this) {
              pQVar5 = &local_80;
              QRegion::translated((QRegion *)pQVar5,(QPoint *)region);
              QRegion::operator+=((QRegion *)(this + 0x48),(QRegion *)pQVar5);
            }
            else {
              local_40.xp.m_i = 0;
              local_40.yp.m_i = 0;
              QVar6 = QWidget::mapTo(widget,parent,&local_40);
              local_80.xp = QVar6.xp.m_i;
              local_80.yp = QVar6.yp.m_i;
              pQVar5 = &local_40;
              QRegion::translated((QRegion *)pQVar5,(QPoint *)region);
              markNeedsFlush(this,parent,(QRegion *)pQVar5);
            }
            QRegion::~QRegion((QRegion *)pQVar5);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetRepaintManager::markNeedsFlush(QWidget *widget, const QRegion &region, const QPoint &topLevelOffset)
{
    if (!widget || widget->d_func()->shouldPaintOnScreen() || region.isEmpty())
        return;

    if (widget == tlw) {
        // Top-level (native)
        qCInfo(lcWidgetPainting) << "Marking" << region << "of top level"
            << widget << "as needing flush";
        topLevelNeedsFlush += region;
    } else if (!hasPlatformWindow(widget) && !widget->isWindow()) {
        QWidget *nativeParent = widget->nativeParentWidget();
        qCInfo(lcWidgetPainting) << "Marking" << region << "of"
                << widget << "as needing flush in" << nativeParent
                << "at offset" << topLevelOffset;
        if (nativeParent == tlw) {
            // Alien widgets with the top-level as the native parent (common case)
            topLevelNeedsFlush += region.translated(topLevelOffset);
        } else {
            // Alien widgets with native parent != tlw
            const QPoint nativeParentOffset = widget->mapTo(nativeParent, QPoint());
            markNeedsFlush(nativeParent, region.translated(nativeParentOffset));
        }
    } else {
        // Native child widgets
        qCInfo(lcWidgetPainting) << "Marking" << region
            << "of native child" << widget << "as needing flush";
        markNeedsFlush(widget, region);
    }
}